

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::NullTypeHandlerBase::
ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
          (NullTypeHandlerBase *this,DynamicObject *instance)

{
  code *pcVar1;
  ScriptContext *this_00;
  byte bVar2;
  bool bVar3;
  BYTE values;
  PropertyTypes values_00;
  int newCount;
  uint uVar4;
  Recycler *pRVar5;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar6;
  undefined4 *puVar7;
  TrackAllocData local_58;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *local_30;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *newTypeHandler
  ;
  Recycler *recycler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)recycler);
  newTypeHandler =
       (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)pRVar5;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
             ,0xea);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_58);
  pSVar6 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)
           new<Memory::Recycler>(0x30,pRVar5,0x43c4b0);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
  SimpleDictionaryTypeHandlerBase(pSVar6,(Recycler *)newTypeHandler);
  local_30 = pSVar6;
  bVar2 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)pSVar6);
  if ((bVar2 & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                ,0xeb,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "(newTypeHandler->GetFlags() & IsPrototypeFlag) == 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this_00 = scriptContext;
  newCount = DynamicTypeHandler::GetSlotCapacity(&local_30->super_DynamicTypeHandler);
  DynamicObject::EnsureSlots
            ((DynamicObject *)this_00,0,newCount,(ScriptContext *)recycler,
             &local_30->super_DynamicTypeHandler);
  bVar2 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if (((bVar2 & 0x20) != 0) != (bool)((this->super_DynamicTypeHandler).field_0x15 & 1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                ,0xee,
                                "(((this->GetFlags() & IsPrototypeFlag) != 0) == this->isPrototype)"
                                ,"((this->GetFlags() & IsPrototypeFlag) != 0) == this->isPrototype")
    ;
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar6 = local_30;
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags(&pSVar6->super_DynamicTypeHandler,' ',values);
  pSVar6 = local_30;
  values_00 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&pSVar6->super_DynamicTypeHandler,0xf0,values_00);
  uVar4 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x65])();
  if ((uVar4 & 1) != 0) {
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties(&local_30->super_DynamicTypeHandler);
  }
  DynamicTypeHandler::SetInstanceTypeHandler
            (&local_30->super_DynamicTypeHandler,(DynamicObject *)scriptContext,true);
  return local_30;
}

Assistant:

T* NullTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        T * newTypeHandler = RecyclerNew(recycler, T, recycler);
        Assert((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0);
        // EnsureSlots before updating the type handler and instance, as EnsureSlots allocates and may throw.
        instance->EnsureSlots(0, newTypeHandler->GetSlotCapacity(), scriptContext, newTypeHandler);
        Assert(((this->GetFlags() & IsPrototypeFlag) != 0) == this->isPrototype);
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
        {
            newTypeHandler->ClearHasOnlyWritableDataProperties();
        }
        newTypeHandler->SetInstanceTypeHandler(instance);

        return newTypeHandler;
    }